

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::LoadUSDFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  string _err;
  string filepath;
  MMapFileHandle handle;
  string base_dir;
  string local_f0;
  Stage *local_d0;
  string local_c8;
  MMapFileHandle local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  io::ExpandFilePath(&local_c8,(string *)_filename,(void *)0x0);
  io::GetBaseDir(&local_50,(string *)_filename);
  bVar1 = io::IsMMapSupported();
  if (!bVar1) {
    local_a8.filename.field_2._M_allocated_capacity = 0;
    local_a8.filename._M_dataplus._M_p = (pointer)0x0;
    local_a8.filename._M_string_length = 0;
    bVar2 = false;
    bVar1 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,
                              (string *)err,&local_c8,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar1) {
      bVar2 = LoadUSDFromMemory((uint8_t *)local_a8.filename._M_dataplus._M_p,
                                local_a8.filename._M_string_length -
                                (long)local_a8.filename._M_dataplus._M_p,(string *)&local_50,stage,
                                warn,err,options);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
    goto LAB_0011a437;
  }
  local_a8.filename._M_dataplus._M_p = (pointer)&local_a8.filename.field_2;
  local_a8.filename._M_string_length = 0;
  local_a8.filename.field_2._M_allocated_capacity =
       local_a8.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_a8.writable = false;
  local_a8.addr = (uint8_t *)0x0;
  local_a8.size = 0;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_d0 = stage;
  bVar1 = io::MMapFile(&local_c8,&local_a8,false,&local_f0);
  if (bVar1) {
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      psVar3 = warn;
LAB_0011a37d:
      ::std::__cxx11::string::append((string *)psVar3);
      ::std::__cxx11::string::_M_dispose();
    }
  }
  else if (err != (string *)0x0) {
    ::std::operator+(&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                     "\n");
    psVar3 = err;
    goto LAB_0011a37d;
  }
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    bVar2 = LoadUSDFromMemory(local_a8.addr,local_a8.size,(string *)&local_c8,local_d0,warn,err,
                              options);
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    io::UnmapFile(&local_a8,&local_f0);
    if ((warn != (string *)0x0) && (local_f0._M_string_length != 0)) {
      ::std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,"\n");
      ::std::__cxx11::string::append((string *)warn);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar2 = false;
  }
  ::std::__cxx11::string::_M_dispose();
LAB_0011a437:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return bVar2;
}

Assistant:

bool LoadUSDFromFile(const std::string &_filename, Stage *stage,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {
  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);
  std::string base_dir = io::GetBaseDir(_filename);

  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    return LoadUSDFromMemory(data.data(), data.size(), base_dir, stage, warn, err,
                             options);
  }
}